

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,uint8_t *index_reg,MemoryAccess access)

{
  anon_class_8_1_8991fb9c local_138;
  StepT local_130;
  anon_class_8_1_8991fb9c local_110;
  StepT local_108;
  anon_class_16_2_354eec14 local_e8;
  StepT local_d8;
  anon_class_8_1_8991fb9c local_b8;
  StepT local_b0;
  anon_class_16_2_354eec14 local_90;
  StepT local_80;
  anon_class_8_1_8991fb9c local_50;
  StepT local_48;
  undefined1 local_25;
  MemoryAccess local_24;
  uint8_t *puStack_20;
  MemoryAccess access_local;
  uint8_t *index_reg_local;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_25 = 0;
  local_24 = access;
  puStack_20 = index_reg;
  index_reg_local = (uint8_t *)this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  Pipeline::Pipeline(__return_storage_ptr__);
  if ((local_24 == Read) || (local_24 == Write)) {
    local_50.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__0,void>
              ((function<void()> *)&local_48,&local_50);
    Pipeline::push(__return_storage_ptr__,&local_48);
    std::function<void_()>::~function(&local_48);
    local_90.index_reg = puStack_20;
    local_90.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__1,void>
              ((function<void()> *)&local_80,&local_90);
    Pipeline::push(__return_storage_ptr__,&local_80);
    std::function<void_()>::~function(&local_80);
  }
  else if (local_24 == ReadWrite) {
    local_b8.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__2,void>
              ((function<void()> *)&local_b0,&local_b8);
    Pipeline::push(__return_storage_ptr__,&local_b0);
    std::function<void_()>::~function(&local_b0);
    local_e8.index_reg = puStack_20;
    local_e8.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__3,void>
              ((function<void()> *)&local_d8,&local_e8);
    Pipeline::push(__return_storage_ptr__,&local_d8);
    std::function<void_()>::~function(&local_d8);
    local_110.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__4,void>
              ((function<void()> *)&local_108,&local_110);
    Pipeline::push(__return_storage_ptr__,&local_108);
    std::function<void_()>::~function(&local_108);
    local_138.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps(unsigned_char_const*,n_e_s::core::MemoryAccess)::__5,void>
              ((function<void()> *)&local_130,&local_138);
    Pipeline::push(__return_storage_ptr__,&local_130);
    std::function<void_()>::~function(&local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_zeropage_indexed_addressing_steps(
        const uint8_t *index_reg,
        MemoryAccess access) {
    Pipeline result;
    if (access == MemoryAccess::Read || access == MemoryAccess::Write) {
        result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
        result.push([this, index_reg] {
            // Dummy read
            mmu_->read_byte(tmp_);
            const uint8_t effective_address_low = tmp_ + *index_reg;
            effective_address_ = effective_address_low;
        });
    } else if (access == MemoryAccess::ReadWrite) {
        result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
        result.push([this, index_reg] {
            // Dummy read
            mmu_->read_byte(tmp_);
            const uint8_t effective_address_low = tmp_ + *index_reg;
            effective_address_ = effective_address_low;
        });
        result.push([this] { tmp_ = mmu_->read_byte(effective_address_); });
        result.push([this] {
            // Extra write to effective address with old value.
            mmu_->write_byte(effective_address_, tmp_);
        });
    }
    return result;
}